

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O3

bignum jbcoin::makeHash(Blob *pubGen,int seq,bignum *order)

{
  int iVar1;
  BIGNUM *a;
  bignum bVar2;
  array<unsigned_char,_41UL> *args;
  array<unsigned_char,_41UL> *extraout_RDX;
  int iVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  void *__src;
  array<unsigned_char,_41UL> buf;
  result_type root;
  jbcoin local_79 [33];
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  result_type local_50;
  undefined4 extraout_var;
  long lVar3;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,seq);
  a = BN_new();
  (pubGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)a;
  if (a == (BIGNUM *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"BN_new() failed");
  }
  __src = (void *)*plVar5;
  lVar3 = plVar5[1];
  if (lVar3 - (long)__src == 0x21) {
    iVar4 = 0;
    do {
      args = (array<unsigned_char,_41UL> *)(lVar3 - (long)__src);
      if (args != (array<unsigned_char,_41UL> *)0x0) {
        memmove(local_79,__src,(size_t)args);
        args = extraout_RDX;
      }
      local_58 = (undefined1)((ulong)order >> 0x18);
      local_57 = (undefined1)((ulong)order >> 0x10);
      local_56 = (undefined1)((ulong)order >> 8);
      local_55 = SUB81(order,0);
      local_54 = (undefined1)((uint)iVar4 >> 0x18);
      local_53 = (undefined1)((uint)iVar4 >> 0x10);
      local_52 = (undefined1)((uint)iVar4 >> 8);
      local_51 = (undefined1)iVar4;
      sha512Half_s<std::array<unsigned_char,41ul>>(&local_50,local_79,args);
      beast::secure_erase<void>(local_79,0x29);
      openssl::bignum::assign((bignum *)pubGen,(uint8_t *)&local_50,0x20);
      beast::secure_erase<void>(&local_50,0x20);
      iVar1 = BN_is_zero(a);
      if (iVar1 == 0) {
        bVar2.ptr._0_4_ = BN_cmp(a,DAT_002e09e0);
        bVar2.ptr._4_4_ = extraout_var;
        if ((int)bVar2.ptr < 0) {
          return (bignum)bVar2.ptr;
        }
      }
      __src = (void *)*plVar5;
      lVar3 = plVar5[1];
      iVar4 = iVar4 + 1;
    } while( true );
  }
  __assert_fail("pubGen.size() == 33",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/crypto/impl/GenerateDeterministicKey.cpp"
                ,0x91,"bignum jbcoin::makeHash(const Blob &, int, const bignum &)");
}

Assistant:

static bignum makeHash (Blob const& pubGen, int seq, bignum const& order)
{
    int subSeq = 0;

    bignum result;

    assert(pubGen.size() == 33);
    do
    {
        // buf: 0          pubGen             33 seq   37 subSeq  41
        //      |<--------------------------->|<------>|<-------->|
        std::array<std::uint8_t, 41> buf;
        std::copy (pubGen.begin(), pubGen.end(), buf.begin());
        copy_uint32 (buf.begin() + 33, seq);
        copy_uint32 (buf.begin() + 37, subSeq++);
        auto root = sha512Half_s(buf);
        beast::secure_erase(buf.data(), buf.size());
        result.assign (root.data(), root.size());
        beast::secure_erase(root.data(), root.size());
    }
    while (result.is_zero()  ||  result >= order);

    return result;
}